

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4faa5c::SpecialName::printLeft(SpecialName *this,OutputStream *S)

{
  OutputStream::operator+=(S,this->Special);
  Node::print(this->Child,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Special;
    Child->print(S);
  }